

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::Prediction(UKF *this,double delta_t)

{
  MatrixXd *pMVar1;
  double *pdVar2;
  VectorXd *pVVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  Matrix<double,_1,1,0,_1,1> *pMVar8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar9;
  uint uVar10;
  Index size_1;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *_other;
  undefined8 *puVar12;
  Index index;
  ulong uVar13;
  undefined1 *puVar14;
  Matrix<double,_1,1,0,_1,1> *pMVar15;
  undefined1 *puVar16;
  char *pcVar17;
  Index index_2;
  ulong uVar18;
  Index index_1;
  double *pdVar19;
  ulong uVar20;
  long lVar21;
  Index col;
  long lVar22;
  Index index_6;
  long lVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  Index row;
  long lVar27;
  Index row_1;
  long lVar28;
  int iVar29;
  bool bVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar31;
  undefined4 uVar32;
  VectorXd x_aug;
  VectorXd x_pred;
  MatrixXd Xsig_aug;
  MatrixXd P_aug;
  MatrixXd P_pred;
  MatrixXd L;
  VectorXd x_diff;
  DenseStorage<double,__1,__1,_1,_0> local_1e8;
  DenseStorage<double,__1,__1,_1,_0> local_1d8;
  DenseStorage<double,__1,__1,__1,_0> local_1c8;
  undefined1 local_1a8 [24];
  MatrixXd *pMStack_190;
  VectorXd *local_188;
  DenseStorage<double,__1,__1,_1,_0> *local_180;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  undefined1 local_148 [16];
  DenseStorage<double,__1,__1,__1,_0> local_138;
  double local_118;
  void *local_110;
  double *local_108;
  long local_100;
  double local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  undefined8 uStack_c0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_b8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  DenseStorage<double,__1,__1,__1,_0> *local_48;
  PlainObject *local_40;
  uint uVar11;
  
  local_118 = delta_t;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1e8,7,7,1);
  if (local_1e8.m_rows < 5) {
    pcVar17 = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
LAB_0010531b:
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                  ,0x8d,pcVar17);
  }
  if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      5) {
    pcVar17 = 
    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_0010523d;
  }
  pVVar3 = &this->x_;
  uVar18 = (ulong)((uint)((ulong)local_1e8.m_data >> 3) & 1);
  uVar13 = 5;
  if (((ulong)local_1e8.m_data & 7) == 0) {
    uVar13 = uVar18;
  }
  if (uVar13 != 0) {
    pdVar19 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar20 = 0;
    do {
      local_1e8.m_data[uVar20] = pdVar19[uVar20];
      uVar20 = uVar20 + 1;
    } while (uVar13 != uVar20);
  }
  uVar13 = uVar13 | 4;
  if (((ulong)local_1e8.m_data & 7) == 0) {
    do {
      pdVar19 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data + uVar18;
      dVar5 = pdVar19[1];
      local_1e8.m_data[uVar18] = *pdVar19;
      (local_1e8.m_data + uVar18)[1] = dVar5;
      uVar18 = uVar18 + 2;
    } while (uVar18 < uVar13);
  }
  if ((uint)uVar13 < 5) {
    pdVar19 = (pVVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    do {
      local_1e8.m_data[uVar13] = pdVar19[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar13 != 5);
  }
  if ((local_1e8.m_rows < 6) ||
     (local_1e8.m_data[5] = 0.0, (double *)local_1e8.m_rows == (double *)0x6)) {
LAB_001051c4:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_1e8.m_data[6] = 0.0;
  local_168.m_cols = 0;
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,0x31,7,7);
  local_1a8._0_8_ = local_168.m_rows;
  local_1a8._8_8_ = local_168.m_cols;
  local_1a8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
  if ((local_168.m_cols | local_168.m_rows) < 0) {
LAB_0010529c:
    local_1a8._16_8_ = 0;
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_168,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_1a8);
  if ((local_168.m_rows < 5) || (local_168.m_cols < 5)) {
    pcVar17 = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
    ;
    goto LAB_0010531b;
  }
  if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       == 5) &&
     ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 5)) {
    uVar13 = 5;
    if (((ulong)local_168.m_data & 7) == 0) {
      uVar13 = (ulong)((uint)((ulong)local_168.m_data >> 3) & 1);
    }
    lVar21 = 0;
    lVar22 = 0;
    pdVar19 = local_168.m_data;
    do {
      if (uVar13 != 0) {
        lVar28 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar24 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar18 = 0;
        do {
          pdVar19[uVar18] = *(double *)((long)pdVar24 + uVar18 * 8 + lVar28 * lVar21);
          uVar18 = uVar18 + 1;
        } while (uVar13 != uVar18);
      }
      uVar20 = (ulong)(5U - (int)uVar13 & 6);
      uVar18 = uVar13;
      if (uVar20 != 0) {
        do {
          pdVar24 = (double *)
                    ((long)(this->P_).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data +
                    uVar18 * 8 +
                    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * lVar21);
          dVar5 = pdVar24[1];
          pdVar19[uVar18] = *pdVar24;
          (pdVar19 + uVar18)[1] = dVar5;
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < (long)(uVar20 + uVar13));
      }
      if (uVar20 + uVar13 < 5) {
        lVar23 = uVar20 + uVar13 + -1;
        lVar28 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar24 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        do {
          pdVar19[lVar23 + 1] = *(double *)((long)pdVar24 + lVar23 * 8 + lVar28 * lVar21 + 8);
          lVar23 = lVar23 + 1;
        } while (lVar23 < 4);
      }
      uVar13 = (ulong)((int)uVar13 + (int)local_168.m_rows & 1);
      lVar22 = lVar22 + 1;
      pdVar19 = pdVar19 + local_168.m_rows;
      lVar21 = lVar21 + 8;
    } while (lVar22 != 5);
    if ((((local_168.m_rows < 6) || (local_168.m_cols < 6)) ||
        (local_168.m_data[local_168.m_rows * 5 + 5] = this->std_a_ * this->std_a_,
        (Matrix<double,_1,1,0,_1,1> *)local_168.m_rows == (Matrix<double,_1,1,0,_1,1> *)0x6)) ||
       ((VectorXd *)local_168.m_cols == (VectorXd *)0x6)) {
LAB_00105167:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    local_168.m_data[local_168.m_rows * 6 + 6] = this->std_yawdd_ * this->std_yawdd_;
    Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
              ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1a8,
               (MatrixType *)&local_168);
    if (pMStack_190._0_1_ == false) {
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Cholesky/LLT.h"
                    ,0x6a,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                   );
    }
    local_1c8.m_data = (double *)local_1a8;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_110,
               (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&local_1c8);
    free((void *)local_1a8._0_8_);
    uVar18 = (ulong)this->n_aug_;
    uVar13 = uVar18 * 2 + 1;
    local_1c8.m_data = (double *)0x0;
    local_1c8.m_rows = 0;
    local_1c8.m_cols = 0;
    if ((long)(uVar13 | uVar18) < 0) {
LAB_0010527d:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((this->n_aug_ != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar13),0) <
        (long)uVar18)) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = operator_delete;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,uVar13 * uVar18,uVar18,uVar13);
    if (local_1c8.m_rows < 0 && local_1c8.m_data != (double *)0x0) {
LAB_00105186:
      __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                    ,0x94,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                   );
    }
    if (local_1c8.m_cols < 1) {
LAB_001051a5:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                    ,0x76,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    if (local_1c8.m_rows == local_1e8.m_rows) {
      pdVar19 = (double *)(ulong)((uint)((ulong)local_1c8.m_data >> 3) & 1);
      if (local_1c8.m_rows <= (long)pdVar19) {
        pdVar19 = (double *)local_1c8.m_rows;
      }
      if (((ulong)local_1c8.m_data & 7) != 0) {
        pdVar19 = (double *)local_1c8.m_rows;
      }
      lVar21 = local_1c8.m_rows - (long)pdVar19;
      if (0 < (long)pdVar19) {
        pdVar24 = (double *)0x0;
        do {
          local_1c8.m_data[(long)pdVar24] = local_1e8.m_data[(long)pdVar24];
          pdVar24 = (double *)((long)pdVar24 + 1);
        } while (pdVar19 != pdVar24);
      }
      pdVar24 = (double *)((lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar19);
      if (1 < lVar21) {
        do {
          dVar5 = (local_1e8.m_data + (long)pdVar19)[1];
          local_1c8.m_data[(long)pdVar19] = local_1e8.m_data[(long)pdVar19];
          (local_1c8.m_data + (long)pdVar19)[1] = dVar5;
          pdVar19 = (double *)((long)pdVar19 + 2);
        } while ((long)pdVar19 < (long)pdVar24);
      }
      if ((long)pdVar24 < local_1c8.m_rows) {
        do {
          local_1c8.m_data[(long)pdVar24] = local_1e8.m_data[(long)pdVar24];
          pdVar24 = (double *)((long)pdVar24 + 1);
          pdVar19 = local_1e8.m_data;
        } while ((double *)local_1c8.m_rows != pdVar24);
      }
      uVar11 = this->n_aug_;
      uVar13 = (ulong)uVar11;
      local_b8 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->P_;
      local_b0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)pVVar3;
      if (0 < (int)uVar11) {
        lVar22 = 8;
        iVar29 = 1;
        lVar28 = 0;
        lVar21 = 0;
        do {
          dVar5 = (double)(int)uVar13 + this->lambda_;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          if (((long)local_108 < 0) &&
             ((void *)((long)local_110 + (long)local_108 * lVar21 * 8) != (void *)0x0))
          goto LAB_00105186;
          if (local_100 <= lVar21) goto LAB_001051a5;
          if ((double *)local_1e8.m_rows != local_108) {
            pcVar17 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_00105273;
          }
          lVar23 = lVar21 + 1;
          pdVar19 = local_1c8.m_data + local_1c8.m_rows * lVar23;
          if (local_1c8.m_rows < 0 && pdVar19 != (double *)0x0) goto LAB_00105186;
          if (local_1c8.m_cols <= lVar23) goto LAB_001051a5;
          if ((double *)local_1c8.m_rows != local_108) {
            pcVar17 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_0010523d;
          }
          pdVar24 = (double *)(ulong)((uint)((ulong)pdVar19 >> 3) & 1);
          if ((long)local_108 <= (long)pdVar24) {
            pdVar24 = local_108;
          }
          if (((ulong)pdVar19 & 7) != 0) {
            pdVar24 = local_108;
          }
          if (0 < (long)pdVar24) {
            pdVar19 = (double *)0x0;
            do {
              *(double *)((long)local_1c8.m_data + (long)pdVar19 * 8 + local_1c8.m_rows * lVar22) =
                   *(double *)((long)local_110 + (long)pdVar19 * 8 + (long)local_108 * lVar28) *
                   dVar5 + local_1e8.m_data[(long)pdVar19];
              pdVar19 = (double *)((long)pdVar19 + 1);
            } while (pdVar24 != pdVar19);
          }
          lVar25 = (long)local_108 - (long)pdVar24;
          pdVar19 = (double *)((lVar25 - (lVar25 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar24);
          if (1 < lVar25) {
            do {
              dVar6 = (local_1e8.m_data + (long)pdVar24)[1];
              pdVar26 = (double *)((long)local_110 + (long)pdVar24 * 8 + (long)local_108 * lVar28);
              dVar7 = pdVar26[1];
              pdVar2 = (double *)
                       ((long)local_1c8.m_data + (long)pdVar24 * 8 + local_1c8.m_rows * lVar22);
              *pdVar2 = *pdVar26 * dVar5 + local_1e8.m_data[(long)pdVar24];
              pdVar2[1] = dVar7 * dVar5 + dVar6;
              pdVar24 = (double *)((long)pdVar24 + 2);
            } while ((long)pdVar24 < (long)pdVar19);
          }
          if ((long)pdVar19 < (long)local_108) {
            do {
              *(double *)((long)local_1c8.m_data + (long)pdVar19 * 8 + local_1c8.m_rows * lVar22) =
                   *(double *)((long)local_110 + (long)pdVar19 * 8 + (long)local_108 * lVar28) *
                   dVar5 + local_1e8.m_data[(long)pdVar19];
              pdVar19 = (double *)((long)pdVar19 + 1);
            } while (local_108 != pdVar19);
          }
          dVar5 = (double)this->n_aug_ + this->lambda_;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          if (((long)local_108 < 0) &&
             ((void *)((long)local_110 + (long)local_108 * lVar21 * 8) != (void *)0x0))
          goto LAB_00105186;
          if (local_100 <= lVar21) goto LAB_001051a5;
          if ((double *)local_1e8.m_rows != local_108) {
            pcVar17 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
            ;
            goto LAB_00105273;
          }
          lVar21 = (long)this->n_aug_;
          lVar25 = (int)lVar23 + lVar21;
          pdVar19 = local_1c8.m_data + local_1c8.m_rows * lVar25;
          if ((local_1c8.m_rows < 0) && (pdVar19 != (double *)0x0)) goto LAB_00105186;
          if (((int)lVar25 < 0) || (local_1c8.m_cols <= lVar25)) goto LAB_001051a5;
          if ((double *)local_1c8.m_rows != local_108) {
            pcVar17 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_0010523d;
          }
          lVar25 = (long)iVar29;
          pdVar24 = (double *)(ulong)((uint)((ulong)pdVar19 >> 3) & 1);
          if ((long)local_108 <= (long)pdVar24) {
            pdVar24 = local_108;
          }
          if (((ulong)pdVar19 & 7) != 0) {
            pdVar24 = local_108;
          }
          if (0 < (long)pdVar24) {
            pdVar19 = (double *)0x0;
            do {
              local_1c8.m_data[(long)((lVar21 + lVar25) * local_1c8.m_rows + (long)pdVar19)] =
                   local_1e8.m_data[(long)pdVar19] -
                   *(double *)((long)local_110 + (long)pdVar19 * 8 + (long)local_108 * lVar28) *
                   dVar5;
              pdVar19 = (double *)((long)pdVar19 + 1);
            } while (pdVar24 != pdVar19);
          }
          lVar27 = (long)local_108 - (long)pdVar24;
          pdVar26 = (double *)((lVar27 - (lVar27 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar24);
          if (1 < lVar27) {
            do {
              dVar6 = (local_1e8.m_data + (long)pdVar24)[1];
              pdVar19 = (double *)((long)local_110 + (long)pdVar24 * 8 + (long)local_108 * lVar28);
              dVar7 = pdVar19[1];
              local_1c8.m_data[(long)((lVar21 + lVar25) * local_1c8.m_rows + (long)pdVar24)] =
                   local_1e8.m_data[(long)pdVar24] - *pdVar19 * dVar5;
              (local_1c8.m_data + (long)((lVar21 + lVar25) * local_1c8.m_rows + (long)pdVar24))[1] =
                   dVar6 - dVar7 * dVar5;
              pdVar24 = (double *)((long)pdVar24 + 2);
            } while ((long)pdVar24 < (long)pdVar26);
          }
          pdVar19 = local_1c8.m_data;
          if ((long)pdVar26 < (long)local_108) {
            pdVar19 = (double *)((long)local_108 * lVar28);
            do {
              local_1c8.m_data[(long)(local_1c8.m_rows * (lVar21 + lVar25) + (long)pdVar26)] =
                   local_1e8.m_data[(long)pdVar26] -
                   *(double *)((long)((long)local_110 + (long)pdVar19) + (long)pdVar26 * 8) * dVar5;
              pdVar26 = (double *)((long)pdVar26 + 1);
            } while (local_108 != pdVar26);
          }
          uVar11 = this->n_aug_;
          uVar13 = (ulong)(int)uVar11;
          lVar22 = lVar22 + 8;
          lVar28 = lVar28 + 8;
          iVar29 = iVar29 + 1;
          lVar21 = lVar23;
        } while (lVar23 < (long)uVar13);
      }
      uVar10 = uVar11 * 2 + 1;
      local_1a8._0_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
      local_1a8._8_8_ = (VectorXd *)0x0;
      local_1a8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
      uVar11 = this->n_x_;
      lVar22 = (long)(int)uVar11;
      lVar21 = (long)(int)uVar10;
      if ((int)(uVar11 | uVar10) < 0) goto LAB_0010527d;
      if ((uVar11 != 0) &&
         (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar4 / SEXT816(lVar21),0) < lVar22)) {
        puVar12 = (undefined8 *)
                  __cxa_allocate_exception(8,pdVar19,SUB168(auVar4 % SEXT816(lVar21),0));
        *puVar12 = operator_delete;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)local_1a8,lVar22 * lVar21,lVar22,lVar21);
      pMVar1 = &this->Xsig_pred_;
      pMVar15 = (Matrix<double,_1,1,0,_1,1> *)
                (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_1a8._0_8_;
      pVVar3 = (VectorXd *)
               (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pMVar8 = (Matrix<double,_1,1,0,_1,1> *)
               (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_1a8._8_8_;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_1a8._16_8_;
      local_1a8._0_8_ = pMVar15;
      local_1a8._8_8_ = pVVar3;
      local_1a8._16_8_ = pMVar8;
      free(pMVar15);
      uVar31 = SUB84(local_118,0);
      uVar32 = (undefined4)((ulong)local_118 >> 0x20);
      if (-1 < this->n_aug_) {
        local_a8 = local_118 * local_118;
        lVar21 = -1;
        do {
          if ((((local_1c8.m_rows < 1) || (lVar21 = lVar21 + 1, local_1c8.m_cols <= lVar21)) ||
              ((ulong)local_1c8.m_rows < (double *)0x2)) ||
             ((((double *)local_1c8.m_rows == (double *)0x2 ||
               ((ulong)local_1c8.m_rows < (double *)0x4)) ||
              (((double *)local_1c8.m_rows == (double *)0x4 ||
               (((ulong)local_1c8.m_rows < (double *)0x6 ||
                ((double *)local_1c8.m_rows == (double *)0x6)))))))) goto LAB_00105167;
          lVar22 = local_1c8.m_rows * lVar21;
          local_148._8_8_ = 0;
          local_148._0_8_ = local_1c8.m_data[lVar22];
          local_f8 = local_1c8.m_data[lVar22 + 1];
          uStack_f0 = 0;
          local_a0 = local_1c8.m_data[lVar22 + 2];
          dVar5 = local_1c8.m_data[lVar22 + 3];
          local_58 = local_1c8.m_data[lVar22 + 4];
          local_98 = local_1c8.m_data[lVar22 + 5];
          local_90 = local_1c8.m_data[lVar22 + 6];
          local_88 = local_58 * (double)CONCAT44(uVar32,uVar31) + dVar5;
          uStack_50 = 0;
          uStack_80 = 0;
          if (ABS(local_58) <= 0.001) {
            local_c8 = local_a0 * (double)CONCAT44(uVar32,uVar31);
            uStack_c0 = 0;
            dVar6 = cos(dVar5);
            local_d8._8_4_ = extraout_XMM0_Dc_02;
            local_d8._0_8_ = dVar6;
            local_d8._12_4_ = extraout_XMM0_Dd_02;
            dVar7 = sin(dVar5);
            dVar6 = (double)local_148._0_8_ + (double)local_d8._0_8_ * local_c8;
            dVar7 = local_f8 + dVar7 * local_c8;
          }
          else {
            local_c8 = local_a0 / local_58;
            uStack_c0 = 0;
            dVar6 = sin(local_88);
            local_d8._8_4_ = extraout_XMM0_Dc;
            local_d8._0_8_ = dVar6;
            local_d8._12_4_ = extraout_XMM0_Dd;
            dVar6 = sin(dVar5);
            local_68._8_4_ = extraout_XMM0_Dc_00;
            local_68._0_8_ = dVar6;
            local_68._12_4_ = extraout_XMM0_Dd_00;
            dVar6 = cos(dVar5);
            local_78._8_4_ = extraout_XMM0_Dc_01;
            local_78._0_8_ = dVar6;
            local_78._12_4_ = extraout_XMM0_Dd_01;
            dVar7 = cos(local_88);
            dVar6 = (double)local_148._0_8_ +
                    local_c8 * ((double)local_d8._0_8_ - (double)local_68._0_8_);
            dVar7 = local_f8 + local_c8 * ((double)local_78._0_8_ - dVar7);
          }
          local_148._8_4_ = SUB84(dVar7,0);
          local_148._0_8_ = dVar6;
          local_148._12_4_ = (int)((ulong)dVar7 >> 0x20);
          local_f8 = cos(dVar5);
          dVar5 = sin(dVar5);
          uVar13 = (this->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if (((long)uVar13 < 1) ||
             ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar21)) goto LAB_00105167;
          dVar6 = local_98 * 0.5 * local_a8;
          pdVar19 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data;
          lVar22 = uVar13 * lVar21;
          pdVar19[lVar22] = local_f8 * dVar6 + (double)local_148._0_8_;
          if ((uVar13 < 2) ||
             (pdVar19[lVar22 + 1] = dVar6 * dVar5 + (double)local_148._8_8_, uVar13 == 2))
          goto LAB_00105167;
          uVar31 = SUB84(local_118,0);
          uVar32 = (undefined4)((ulong)local_118 >> 0x20);
          pdVar19[lVar22 + 2] = local_98 * local_118 + local_a0;
          if ((uVar13 < 4) ||
             (pdVar19[lVar22 + 3] = local_90 * 0.5 * local_a8 + local_88, uVar13 == 4))
          goto LAB_00105167;
          pdVar19[lVar22 + 4] = local_90 * local_118 + local_58;
        } while (SBORROW8(lVar21,(long)this->n_aug_ * 2) != lVar21 + (long)this->n_aug_ * -2 < 0);
      }
      local_1a8._8_8_ = &this->weights_;
      local_148._0_8_ = local_1a8._8_8_;
      local_1a8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
      pMStack_190 = (MatrixXd *)0x0;
      local_1a8._0_8_ = pMVar1;
      if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols !=
          (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows) {
        __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/ProductBase.h"
                      ,0x66,
                      "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      _other = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_1a8);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_1d8,*(DenseIndex *)(_other + 8),*(DenseIndex *)(_other + 8),1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1d8,_other);
      if ((undefined1 *)local_1d8.m_rows == *(undefined1 **)(_other + 8)) {
        puVar14 = (undefined1 *)(local_1d8.m_rows - (local_1d8.m_rows >> 0x3f) & 0xfffffffffffffffe)
        ;
        if (1 < local_1d8.m_rows) {
          lVar21 = 0;
          do {
            pdVar19 = (double *)(*(long *)_other + lVar21 * 8);
            dVar5 = pdVar19[1];
            local_1d8.m_data[lVar21] = *pdVar19;
            (local_1d8.m_data + lVar21)[1] = dVar5;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)puVar14);
        }
        if ((long)puVar14 < local_1d8.m_rows) {
          lVar21 = *(long *)_other;
          do {
            local_1d8.m_data[(long)puVar14] = *(double *)(lVar21 + (long)puVar14 * 8);
            puVar14 = puVar14 + 1;
          } while ((undefined1 *)local_1d8.m_rows != puVar14);
        }
        free((void *)local_1a8._16_8_);
        local_138.m_data = (double *)0x0;
        local_138.m_rows = 0;
        local_138.m_cols = 0;
        lVar21 = (long)this->n_x_;
        if (lVar21 < 0) goto LAB_0010527d;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,lVar21 * lVar21,lVar21,lVar21)
        ;
        local_1a8._0_8_ = local_138.m_rows;
        local_1a8._8_8_ = local_138.m_cols;
        local_1a8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
        if ((local_138.m_cols | local_138.m_rows) < 0) goto LAB_0010529c;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_138,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_1a8);
        if (-1 < this->n_aug_) {
          lVar21 = 0;
          do {
            pVVar3 = (VectorXd *)
                     (this->Xsig_pred_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            pMVar15 = (Matrix<double,_1,1,0,_1,1> *)
                      ((this->Xsig_pred_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + (long)pVVar3 * lVar21);
            if ((long)pVVar3 < 0 && pMVar15 != (Matrix<double,_1,1,0,_1,1> *)0x0) goto LAB_00105186;
            if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar21) goto LAB_001051a5;
            local_180 = &local_1d8;
            local_1a8._0_8_ = pMVar15;
            local_1a8._8_8_ = pVVar3;
            pMStack_190 = pMVar1;
            local_188 = pVVar3;
            if (pVVar3 != (VectorXd *)local_1d8.m_rows) {
              pcVar17 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
LAB_00105273:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x84,pcVar17);
            }
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((Matrix<double,_1,1,0,_1,1> *)&local_e8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_1a8);
            if (local_e0 < 4) goto LAB_001051c4;
            dVar5 = *(double *)((long)local_e8 + 0x18);
            if (3.141592653589793 < dVar5) {
              do {
                dVar5 = dVar5 + -6.283185307179586;
              } while (3.141592653589793 < dVar5);
              *(double *)((long)local_e8 + 0x18) = dVar5;
            }
            if (dVar5 < -3.141592653589793) {
              do {
                dVar5 = dVar5 + 6.283185307179586;
              } while (dVar5 < -3.141592653589793);
              *(double *)((long)local_e8 + 0x18) = dVar5;
            }
            if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= lVar21) goto LAB_001051c4;
            local_1a8._8_8_ = *(ulong *)(*(long *)local_148._0_8_ + lVar21 * 8);
            pMStack_190 = (MatrixXd *)0x0;
            local_188 = (VectorXd *)0x0;
            local_180 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
            local_1a8._0_8_ = (Matrix<double,_1,1,0,_1,1> *)&local_e8;
            local_1a8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)&local_e8;
            local_48 = &local_138;
            local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_1a8);
            if (((Matrix<double,_1,1,0,_1,1> *)local_138.m_rows !=
                 *(Matrix<double,_1,1,0,_1,1> **)(local_1a8._0_8_ + 8)) ||
               ((undefined1 *)local_138.m_cols != *(undefined1 **)(local_1a8._16_8_ + 8))) {
              pcVar17 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
              ;
              goto LAB_00105273;
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_138,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                        *)&local_48);
            free(pMStack_190);
            free(local_e8);
            bVar30 = SBORROW8(lVar21,(long)this->n_aug_ * 2);
            lVar22 = lVar21 + (long)this->n_aug_ * -2;
            lVar21 = lVar21 + 1;
          } while (bVar30 != lVar22 < 0);
        }
        pPVar9 = local_b0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                  (local_b0,(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1d8);
        puVar14 = (undefined1 *)
                  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
        if (puVar14 == (undefined1 *)local_1d8.m_rows) {
          puVar16 = (undefined1 *)((long)puVar14 - ((long)puVar14 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)puVar14) {
            lVar21 = 0;
            do {
              dVar5 = (local_1d8.m_data + lVar21)[1];
              pdVar19 = (double *)(*(long *)pPVar9 + lVar21 * 8);
              *pdVar19 = local_1d8.m_data[lVar21];
              pdVar19[1] = dVar5;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)puVar16);
          }
          if ((long)puVar16 < (long)puVar14) {
            lVar21 = *(long *)pPVar9;
            do {
              *(double *)(lVar21 + (long)puVar16 * 8) = local_1d8.m_data[(long)puVar16];
              puVar16 = puVar16 + 1;
            } while (puVar14 != puVar16);
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (local_b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_138);
          free(local_138.m_data);
          free(local_1d8.m_data);
          free(local_1c8.m_data);
          free(local_110);
          free(local_168.m_data);
          free(local_1e8.m_data);
          return;
        }
      }
      pcVar17 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
    else {
      pcVar17 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
  }
  else {
    pcVar17 = 
    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
    ;
  }
LAB_0010523d:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar17);
}

Assistant:

void UKF::Prediction(double delta_t) {
  /**
  TODO:

  Complete this function! Estimate the object's location. Modify the state
  vector, x_. Predict sigma points, the state, and the state covariance matrix.
  */

  //create augmented mean state
  VectorXd x_aug = VectorXd(7);
  x_aug.head(5) = x_;
  x_aug(5) = 0;
  x_aug(6) = 0;

  //create augmented covariance matrix
  MatrixXd P_aug = MatrixXd(7, 7);
  P_aug.fill(0.0);
  P_aug.topLeftCorner(5,5) = P_;
  P_aug(5,5) = std_a_*std_a_;
  P_aug(6,6) = std_yawdd_*std_yawdd_;

  //calculate square root of P
  MatrixXd L = P_aug.llt().matrixL();

  //create augmented sigma points
  MatrixXd Xsig_aug = MatrixXd(n_aug_, 2 * n_aug_ + 1);
  Xsig_aug.col(0)  = x_aug;
  for (int i = 0; i< n_aug_; i++)
  {
    Xsig_aug.col(i+1)       = x_aug + sqrt(lambda_+n_aug_) * L.col(i);
    Xsig_aug.col(i+1+n_aug_) = x_aug - sqrt(lambda_+n_aug_) * L.col(i);
  }

  //predict sigma points
  Xsig_pred_ = MatrixXd(n_x_, 2 * n_aug_ + 1);
  for (int i = 0; i< 2*n_aug_+1; i++)
  {
    //extract values for better readability
    double p_x = Xsig_aug(0,i);
    double p_y = Xsig_aug(1,i);
    double v = Xsig_aug(2,i);
    double yaw = Xsig_aug(3,i);
    double yawd = Xsig_aug(4,i);
    double nu_a = Xsig_aug(5,i);
    double nu_yawdd = Xsig_aug(6,i);

    //predicted state values
    double px_p, py_p;
    double v_p = v;
    double yaw_p = yaw + yawd*delta_t;
    double yawd_p = yawd;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v/yawd * ( sin (yaw_p) - sin(yaw));
      py_p = p_y + v/yawd * ( cos(yaw) - cos(yaw_p) );
    }
    else {
      px_p = p_x + v*delta_t*cos(yaw);
      py_p = p_y + v*delta_t*sin(yaw);
    }

    //add noise
    double dt2 = delta_t * delta_t;
    px_p += 0.5*nu_a*dt2 * cos(yaw);
    py_p += 0.5*nu_a*dt2 * sin(yaw);
    v_p  += nu_a*delta_t;

    yaw_p  += 0.5*nu_yawdd*dt2;
    yawd_p += nu_yawdd*delta_t;

    //write predicted sigma point into right column
    Xsig_pred_(0,i) = px_p;
    Xsig_pred_(1,i) = py_p;
    Xsig_pred_(2,i) = v_p;
    Xsig_pred_(3,i) = yaw_p;
    Xsig_pred_(4,i) = yawd_p;
  }
  

  //predicted state mean
  VectorXd x_pred = Xsig_pred_ * weights_ ;

  //predicted state covariance matrix
  MatrixXd P_pred = MatrixXd(n_x_, n_x_);
  P_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

  // state difference
  VectorXd x_diff = Xsig_pred_.col(i) - x_pred;
  //angle normalization
  while (x_diff(3)> M_PI) x_diff(3)-=2.*M_PI;
  while (x_diff(3)<-M_PI) x_diff(3)+=2.*M_PI;

    P_pred = P_pred + weights_(i) * x_diff * x_diff.transpose() ;
  }

  x_ = x_pred;
  P_ = P_pred;
}